

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::SystemVerilogCodeGen(SystemVerilogCodeGen *this,Generator *generator)

{
  SystemVerilogCodeGenOptions local_68;
  
  local_68.package_name._M_dataplus._M_p = (pointer)&local_68.package_name.field_2;
  local_68.unique_case = true;
  local_68.yosys_src = false;
  local_68.package_name._M_string_length = 0;
  local_68.package_name.field_2._M_local_buf[0] = '\0';
  local_68.line_wrap = 0x50;
  local_68.output_dir._M_dataplus._M_p = (pointer)&local_68.output_dir.field_2;
  local_68.output_dir._M_string_length = 0;
  local_68.output_dir.field_2._M_local_buf[0] = '\0';
  local_68.extract_debug_info = false;
  SystemVerilogCodeGen(this,generator,&local_68);
  SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions(&local_68);
  return;
}

Assistant:

SystemVerilogCodeGen::SystemVerilogCodeGen(Generator* generator)
    : SystemVerilogCodeGen(generator, {}) {}